

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

bool testing::internal::TuplePrefix<3ul>::
     Matches<std::tuple<testing::Matcher<fmt::BasicStringRef<char>>,testing::Matcher<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,MultiObjMockProblemBuilder,mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>>&>,testing::Matcher<int>>,std::tuple<fmt::BasicStringRef<char>,mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,MultiObjMockProblemBuilder,mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>>&,int>>
               (tuple<testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_&>,_testing::Matcher<int>_>
                *matcher_tuple,
               tuple<fmt::BasicStringRef<char>,_mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_&,_int>
               *value_tuple)

{
  MatcherInterface<int> *pMVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  
  bVar2 = TuplePrefix<2ul>::
          Matches<std::tuple<testing::Matcher<fmt::BasicStringRef<char>>,testing::Matcher<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,MultiObjMockProblemBuilder,mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>>&>,testing::Matcher<int>>,std::tuple<fmt::BasicStringRef<char>,mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,MultiObjMockProblemBuilder,mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>>&,int>>
                    (matcher_tuple,value_tuple);
  if (bVar2) {
    pMVar1 = (matcher_tuple->
             super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_&>,_testing::Matcher<int>_>
             ).
             super__Tuple_impl<1UL,_testing::Matcher<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_&>,_testing::Matcher<int>_>
             .super__Tuple_impl<2UL,_testing::Matcher<int>_>.
             super__Head_base<2UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>
             .impl_.value_;
    iVar4 = (*(pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                      (pMVar1,(ulong)(uint)(value_tuple->
                                           super__Tuple_impl<0UL,_fmt::BasicStringRef<char>,_mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_&,_int>
                                           ).
                                           super__Tuple_impl<1UL,_mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_&,_int>
                                           .super__Tuple_impl<2UL,_int>.
                                           super__Head_base<2UL,_int,_false>._M_head_impl);
    uVar3 = (undefined1)iVar4;
  }
  else {
    uVar3 = 0;
  }
  return (bool)uVar3;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    using ::std::tr1::get;
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple)
        && get<N - 1>(matcher_tuple).Matches(get<N - 1>(value_tuple));
  }